

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionSignature.cpp
# Opt level: O0

bool Jinx::Impl::operator==(FunctionSignature *left,FunctionSignature *right)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference_conflict1 left_00;
  reference_conflict1 right_00;
  __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
  local_38;
  __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
  local_30;
  const_iterator rightPart;
  const_iterator leftPart;
  FunctionSignature *right_local;
  FunctionSignature *left_local;
  
  sVar2 = std::
          vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
          ::size(&left->m_parts);
  sVar3 = std::
          vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
          ::size(&right->m_parts);
  if (sVar2 == sVar3) {
    rightPart = std::
                vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                ::begin(&left->m_parts);
    local_30._M_current =
         (FunctionSignaturePart *)
         std::
         vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
         ::begin(&right->m_parts);
    while( true ) {
      local_38._M_current =
           (FunctionSignaturePart *)
           std::
           vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           ::end(&left->m_parts);
      bVar1 = __gnu_cxx::operator!=(&rightPart,&local_38);
      if (!bVar1) break;
      left_00 = __gnu_cxx::
                __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
                ::operator*(&rightPart);
      right_00 = __gnu_cxx::
                 __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
                 ::operator*(&local_30);
      bVar1 = operator==(left_00,right_00);
      if (!bVar1) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
      ::operator++(&rightPart);
      __gnu_cxx::
      __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
      ::operator++(&local_30);
    }
    left_local._7_1_ = true;
  }
  else {
    left_local._7_1_ = false;
  }
  return left_local._7_1_;
}

Assistant:

inline_t bool operator == (const FunctionSignature & left, const FunctionSignature & right)
	{
		// If there's any discrepency in size, then the signatures aren't equal
		if (left.m_parts.size() != right.m_parts.size())
			return false;

		// Compare all parts between left and right operands.  If any are different,
		// then the signature is not equivalant.
		auto leftPart = left.m_parts.begin();
		auto rightPart = right.m_parts.begin();
		while (leftPart != left.m_parts.end())
		{
			if (!(*leftPart == *rightPart))
				return false;
			++leftPart;
			++rightPart;
		}
		return true;
	}